

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortrclut_p.h
# Opt level: O0

QRgba64 __thiscall QColorTrcLut::fromLinear(QColorTrcLut *this,QRgba64 rgb64)

{
  long lVar1;
  pointer puVar2;
  undefined8 in_RSI;
  long in_FS_OFFSET;
  int bidx;
  int gidx;
  int ridx;
  __m128i vidx;
  __m128i v;
  QRgba64 rgba64;
  undefined4 local_118;
  ushort local_b8;
  ushort uStack_b6;
  ushort uStack_b4;
  ushort uStack_b2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::get
                     ((unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *)
                      0xb7db07);
  local_b8 = (ushort)in_RSI;
  uStack_b6 = (ushort)((ulong)in_RSI >> 0x10);
  uStack_b4 = (ushort)((ulong)in_RSI >> 0x20);
  uStack_b2 = (ushort)((ulong)in_RSI >> 0x30);
  uStack_b2 = uStack_b2 - (uStack_b2 >> 8);
  local_118 = CONCAT22(puVar2[(int)(uint)((ushort)(uStack_b6 - (uStack_b6 >> 8)) >> 4)] +
                       (puVar2[(int)(uint)((ushort)(uStack_b6 - (uStack_b6 >> 8)) >> 4)] >> 8),
                       puVar2[(int)(uint)((ushort)(local_b8 - (local_b8 >> 8)) >> 4)] +
                       (puVar2[(int)(uint)((ushort)(local_b8 - (local_b8 >> 8)) >> 4)] >> 8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QRgba64)CONCAT26(uStack_b2 + (uStack_b2 >> 8),
                             CONCAT24(puVar2[(int)(uint)((ushort)(uStack_b4 - (uStack_b4 >> 8)) >> 4
                                                        )] +
                                      (puVar2[(int)(uint)((ushort)(uStack_b4 - (uStack_b4 >> 8)) >>
                                                         4)] >> 8),local_118));
  }
  __stack_chk_fail();
}

Assistant:

QRgba64 fromLinear(QRgba64 rgb64) const
    {
        return convertWithTable(rgb64, m_fromLinear.get());
    }